

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::ElseConstraintClauseSyntax::setChild
          (ElseConstraintClauseSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  Token TVar2;
  
  if (index == 0) {
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->elseKeyword).kind = TVar2.kind;
    (this->elseKeyword).field_0x2 = TVar2._2_1_;
    (this->elseKeyword).numFlags = (NumericTokenFlags)TVar2.numFlags.raw;
    (this->elseKeyword).rawLen = TVar2.rawLen;
    (this->elseKeyword).info = TVar2.info;
  }
  else {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar1 = (SyntaxNode *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
    }
    (this->constraints).ptr = (ConstraintItemSyntax *)pSVar1;
  }
  return;
}

Assistant:

void ElseConstraintClauseSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: elseKeyword = child.token(); return;
        case 1: constraints = child.node() ? &child.node()->as<ConstraintItemSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}